

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmap.cpp
# Opt level: O2

void test2(void)

{
  HeapMap<LinkedNode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *this;
  LinkedNode *k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_38;
  allocator local_31;
  
  this = TinyGC::
         MakeGarbageCollected<HeapMap<LinkedNode,std::__cxx11::string,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
                   (tg);
  for (local_38 = 0; local_38 < 10; local_38 = local_38 + 1) {
    local_58._M_dataplus._M_p = (pointer)0x0;
    k = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int&>
                  (tg,(void **)&local_58,&local_38);
    std::__cxx11::string::string((string *)&local_58,"122",&local_31);
    HeapMap<LinkedNode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
    ::insert(this,k,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void test2() {
  HeapMap<LinkedNode, std::string> *p =
      MakeGarbageCollected<HeapMap<LinkedNode, std::string>>();
  for (int id = 0; id < 10; id++) {
    auto t = MakeGarbageCollected<LinkedNode>(nullptr, id);
    p->insert(t, "122");
  }
}